

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::PathTypeHandlerWithAttr::SetProperty
          (PathTypeHandlerWithAttr *this,DynamicObject *instance,PropertyId propertyId,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  byte bVar1;
  code *pcVar2;
  PropertyIndex PVar3;
  ushort propertyIndex;
  PropertyValueInfo *pPVar4;
  DynamicObject *pDVar5;
  bool bVar6;
  PropertyAttributes PVar7;
  PropertyIndex PVar8;
  int iVar9;
  uint uVar10;
  BOOL BVar11;
  ObjectSlotAttributes **ppOVar12;
  uchar **ppuVar13;
  undefined4 *puVar14;
  Var aValue;
  PathTypeHandlerWithAttr *pPVar15;
  ScriptContext *pSVar16;
  PropertyRecord *pPVar17;
  byte local_59;
  DescriptorFlags descriptorFlags;
  PropertyAttributes attributes;
  DynamicTypeHandler *typeHandler;
  RecyclableObject *func;
  PropertyValueInfo *pPStack_40;
  PropertyIndex index;
  PropertyValueInfo *info_local;
  Var pvStack_30;
  PropertyOperationFlags flags_local;
  Var value_local;
  DynamicObject *pDStack_20;
  PropertyId propertyId_local;
  DynamicObject *instance_local;
  PathTypeHandlerWithAttr *this_local;
  
  pPStack_40 = info;
  info_local._4_4_ = flags;
  pvStack_30 = value;
  value_local._4_4_ = propertyId;
  pDStack_20 = instance;
  instance_local = (DynamicObject *)this;
  func._6_2_ = PathTypeHandlerBase::GetPropertyIndex((PathTypeHandlerBase *)this,propertyId);
  if (func._6_2_ != 0xffff) {
    ppOVar12 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                         ((WriteBarrierPtr *)&this->attributes);
    if (((*ppOVar12)[func._6_2_] & ObjectSlotAttr_Accessor) != ObjectSlotAttr_None) {
      ppuVar13 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                           ((WriteBarrierPtr *)&this->setters);
      if ((*ppuVar13)[func._6_2_] == 0xffff) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                    ,0xf16,"(setters[index] != Constants::NoSlot)",
                                    "setters[index] != Constants::NoSlot");
        if (!bVar6) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar14 = 0;
      }
      pDVar5 = pDStack_20;
      ppuVar13 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                           ((WriteBarrierPtr *)&this->setters);
      aValue = DynamicObject::GetSlot(pDVar5,(uint)(*ppuVar13)[func._6_2_]);
      typeHandler = (DynamicTypeHandler *)VarTo<Js::RecyclableObject>(aValue);
      Js::JavascriptOperators::CallSetter
                ((RecyclableObject *)typeHandler,pDStack_20,pvStack_30,(ScriptContext *)0x0);
      pPVar15 = (PathTypeHandlerWithAttr *)DynamicObject::GetTypeHandler(pDStack_20);
      _descriptorFlags = pPVar15;
      if (pPVar15 == this) {
        ppOVar12 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                             ((WriteBarrierPtr *)&this->attributes);
        if (((*ppOVar12)[func._6_2_] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
          func._6_2_ = PathTypeHandlerBase::GetPropertyIndex
                                 ((PathTypeHandlerBase *)this,value_local._4_4_);
          ppOVar12 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                               ((WriteBarrierPtr *)&this->attributes);
          if (((*ppOVar12)[func._6_2_] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
            return 1;
          }
        }
        PVar3 = func._6_2_;
        PVar8 = PathTypeHandlerBase::GetPropertyIndex((PathTypeHandlerBase *)this,value_local._4_4_)
        ;
        if (PVar3 != PVar8) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar14 = 1;
          bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                      ,0xf2a,
                                      "(index == PathTypeHandlerBase::GetPropertyIndex(propertyId))"
                                      ,"index == PathTypeHandlerBase::GetPropertyIndex(propertyId)")
          ;
          if (!bVar6) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar14 = 0;
        }
        ppOVar12 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                             ((WriteBarrierPtr *)&this->attributes);
        pDVar5 = pDStack_20;
        pPVar4 = pPStack_40;
        propertyIndex = func._6_2_;
        if (((*ppOVar12)[func._6_2_] & ObjectSlotAttr_Accessor) == ObjectSlotAttr_None) {
          ppOVar12 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                               ((WriteBarrierPtr *)&this->attributes);
          PVar7 = PathTypeHandlerBase::ObjectSlotAttributesToPropertyAttributes
                            ((*ppOVar12)[func._6_2_]);
          PropertyValueInfo::Set
                    (pPVar4,&pDVar5->super_RecyclableObject,propertyIndex,PVar7,InlineCacheNoFlags);
        }
        else {
          ppuVar13 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_char__
                               ((WriteBarrierPtr *)&this->setters);
          bVar1 = (*ppuVar13)[func._6_2_];
          ppOVar12 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                               ((WriteBarrierPtr *)&this->attributes);
          PVar7 = PathTypeHandlerBase::ObjectSlotAttributesToPropertyAttributes
                            ((*ppOVar12)[func._6_2_]);
          PropertyValueInfo::Set
                    (pPVar4,&pDVar5->super_RecyclableObject,(ushort)bVar1,PVar7,
                     InlineCacheSetterFlag);
        }
      }
      else {
        pSVar16 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
        pPVar17 = ScriptContext::GetPropertyName(pSVar16,value_local._4_4_);
        iVar9 = (*(pPVar15->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0xc])(pPVar15,pPVar17);
        func._6_2_ = (PropertyIndex)iVar9;
        if (func._6_2_ == 0xffff) {
          return 1;
        }
        iVar9 = (*(_descriptorFlags->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                  super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x3c])
                          (_descriptorFlags,pDStack_20,(ulong)value_local._4_4_,(ulong)func._6_2_,
                           &local_59);
        pDVar5 = pDStack_20;
        uVar10 = value_local._4_4_;
        pPVar4 = pPStack_40;
        pPVar15 = _descriptorFlags;
        if (iVar9 == 0) {
          return 1;
        }
        if ((local_59 & 8) != 0) {
          return 1;
        }
        pSVar16 = RecyclableObject::GetScriptContext(&pDStack_20->super_RecyclableObject);
        uVar10 = (*(pPVar15->super_PathTypeHandlerNoAttr).super_PathTypeHandlerBase.
                   super_DynamicTypeHandler._vptr_DynamicTypeHandler[0x1a])
                           (pPVar15,pDVar5,(ulong)uVar10,&typeHandler,pPVar4,pSVar16);
        if ((uVar10 & 2) != 0) {
          PropertyValueInfo::Set
                    (pPStack_40,&pDStack_20->super_RecyclableObject,func._6_2_,local_59,
                     InlineCacheNoFlags);
        }
      }
      return 1;
    }
    ppOVar12 = Memory::WriteBarrierPtr::operator_cast_to_ObjectSlotAttributes__
                         ((WriteBarrierPtr *)&this->attributes);
    if (((*ppOVar12)[func._6_2_] & ObjectSlotAttr_Deleted) != ObjectSlotAttr_None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar14 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0xf50,"(0)","Re-add of deleted property NYI in PathTypeHandler");
      if (!bVar6) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar14 = 0;
    }
  }
  BVar11 = PathTypeHandlerBase::SetPropertyInternal<false>
                     ((PathTypeHandlerBase *)this,pDStack_20,value_local._4_4_,func._6_2_,pvStack_30
                      ,ObjectSlotAttr_Default,pPStack_40,info_local._4_4_,SideEffects_Any,false);
  return BVar11;
}

Assistant:

BOOL PathTypeHandlerWithAttr::SetProperty(DynamicObject* instance, PropertyId propertyId, Var value, PropertyOperationFlags flags, PropertyValueInfo* info)
    {
        PropertyIndex index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
        if (index != Constants::NoSlot)
        {
            if (attributes[index] & ObjectSlotAttr_Accessor)
            {
                Assert(setters[index] != Constants::NoSlot);
                RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(setters[index]));
                JavascriptOperators::CallSetter(func, instance, value, NULL);

                // Wait for the setter to return before setting up the inline cache info, as the setter may change
                // the attributes
                DynamicTypeHandler *typeHandler = instance->GetTypeHandler();
                if (typeHandler == this)
                {
                    // Common path: setter didn't change the handler. Do the rest without virtual calls.
                    if (attributes[index] & ObjectSlotAttr_Deleted)
                    {
                        // Delete and re-add may have changed the index.
                        index = PathTypeHandlerBase::GetPropertyIndex(propertyId);
                        if (attributes[index] & ObjectSlotAttr_Deleted)
                        {
                            // Current state is really "deleted". Don't cache.
                            return TRUE;
                        }
                    }
                    Assert(index == PathTypeHandlerBase::GetPropertyIndex(propertyId));

                    if (attributes[index] & ObjectSlotAttr_Accessor)
                    {
                        PropertyValueInfo::Set(info, instance, setters[index], ObjectSlotAttributesToPropertyAttributes(attributes[index]), InlineCacheSetterFlag);
                    }
                    else
                    {
                        PropertyValueInfo::Set(info, instance, index, ObjectSlotAttributesToPropertyAttributes(attributes[index]), InlineCacheNoFlags);
                    }
                }
                else
                {
                    PropertyAttributes attributes;
                    index = typeHandler->GetPropertyIndex(instance->GetScriptContext()->GetPropertyName(propertyId));
                    if (index == Constants::NoSlot)
                    {
                        return TRUE;
                    }
                    if (typeHandler->GetAttributesWithPropertyIndex(instance, propertyId, index, &attributes) == FALSE)
                    {
                        return TRUE;
                    }
                    if (attributes & PropertyDeleted)
                    {
                        return TRUE;
                    }
                    DescriptorFlags descriptorFlags = typeHandler->GetSetter(instance, propertyId, (Var*)&func, info, instance->GetScriptContext());
                    if (descriptorFlags & Data)
                    {
                        PropertyValueInfo::Set(info, instance, index, attributes, InlineCacheNoFlags);
                    }
                }

                return TRUE;
            }
            else if (attributes[index] & ObjectSlotAttr_Deleted)
            {
                AssertMsg(0, "Re-add of deleted property NYI in PathTypeHandler");
            }
        }
        return SetPropertyInternal<false>(instance, propertyId, index, value, ObjectSlotAttr_Default, info, flags, SideEffects_Any);
    }